

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.hpp
# Opt level: O1

void __thiscall
helics::InputData::InputData
          (InputData *this,string_view n_name,string_view n_type,string_view n_units)

{
  this->coreID = -1700000000;
  this->id = 0xffffffff;
  (this->lastData).dblock._M_len = 0;
  (this->lastData).dblock._M_str = (char *)0x0;
  (this->lastData).ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->lastData).ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lastUpdate).internalTimeCode = 0;
  (this->lastQuery).internalTimeCode = 0;
  this->sourceIndex = 0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->name,n_name._M_str,n_name._M_str + n_name._M_len);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->type,n_type._M_str,n_type._M_str + n_type._M_len);
  (this->units)._M_dataplus._M_p = (pointer)&(this->units).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->units,n_units._M_str,n_units._M_str + n_units._M_len);
  (this->pubtype)._M_dataplus._M_p = (pointer)&(this->pubtype).field_2;
  (this->pubtype)._M_string_length = 0;
  (this->pubtype).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (_Invoker_type)0x0;
  this->hasUpdate = false;
  return;
}

Assistant:

InputData(std::string_view n_name, std::string_view n_type, std::string_view n_units):
        name(n_name), type(n_type), units(n_units)
    {
    }